

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O0

unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
ddd::make_unique<ddd::DaTrie<true,true,false>>(void)

{
  tuple<ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  in_RDI;
  pointer in_stack_ffffffffffffffc8;
  __uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  this;
  
  this._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl =
       (tuple<ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
        )(tuple<ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
          )in_RDI.
           super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl;
  operator_new(0x70);
  DaTrie<true,_true,_false>::DaTrie
            ((DaTrie<true,_true,_false> *)
             this._M_t.
             super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
             .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl);
  std::unique_ptr<ddd::DaTrie<true,true,false>,std::default_delete<ddd::DaTrie<true,true,false>>>::
  unique_ptr<std::default_delete<ddd::DaTrie<true,true,false>>,void>
            ((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
              *)this._M_t.
                super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl,
             in_stack_ffffffffffffffc8);
  return (__uniq_ptr_data<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>,_true,_true>
          )(__uniq_ptr_data<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_ddd::DaTrie<true,_true,_false>_*,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
             .super__Head_base<0UL,_ddd::DaTrie<true,_true,_false>_*,_false>._M_head_impl;
}

Assistant:

inline std::unique_ptr<T> make_unique(Ts&& ... params) {
  return std::unique_ptr<T>(new T(std::forward<Ts>(params)...));
}